

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

void __thiscall Vgm_Emu::Vgm_Emu(Vgm_Emu *this)

{
  Music_Emu *pMVar1;
  Classic_Emu *in_RDI;
  equalizer_t *in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  Vgm_Emu_Impl *in_stack_ffffffffffffffc0;
  
  Vgm_Emu_Impl::Vgm_Emu_Impl(in_stack_ffffffffffffffc0);
  (in_RDI->super_Music_Emu).super_Gme_File._vptr_Gme_File = (_func_int **)&PTR__Vgm_Emu_00b904e0;
  in_RDI[1].super_Music_Emu.super_Gme_File._vptr_Gme_File = (_func_int **)&PTR__Vgm_Emu_00b905a0;
  in_RDI[8].super_Music_Emu.super_Gme_File.playlist_warning[0x30] = '\0';
  pMVar1 = &in_RDI[8].super_Music_Emu;
  (pMVar1->super_Gme_File).playlist_warning[0x20] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x21] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x22] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x23] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x24] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x25] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x26] = '\0';
  (pMVar1->super_Gme_File).playlist_warning[0x27] = '\0';
  Gme_File::set_type((Gme_File *)in_RDI,&gme_vgm_type_);
  Classic_Emu::set_voice_types(in_RDI,Vgm_Emu::types);
  Music_Emu::set_silence_lookahead(&in_RDI->super_Music_Emu,1);
  Music_Emu::make_equalizer(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Music_Emu::set_equalizer(&in_RDI->super_Music_Emu,in_stack_ffffffffffffff88);
  return;
}

Assistant:

Vgm_Emu::Vgm_Emu()
{
	disable_oversampling_ = false;
	psg_rate   = 0;
	set_type( gme_vgm_type );
	
	static int const types [8] = {
		wave_type | 1, wave_type | 0, wave_type | 2, noise_type | 0
	};
	set_voice_types( types );
	
	set_silence_lookahead( 1 ); // tracks should already be trimmed
	
	set_equalizer( make_equalizer( -14.0, 80 ) );
}